

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

string * __thiscall
pbrt::LightBounds::ToString_abi_cxx11_(string *__return_storage_ptr__,LightBounds *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Bounds3<float>const&,pbrt::Vector3<float>const&,float_const&,float_const&,float_const&,float_const&,float_const&,bool_const&>
            (__return_storage_ptr__,
             "[ LightBounds b: %s w: %s phi: %f theta_o: %f theta_e: %f cosTheta_o: %f cosTheta_e: %f twoSided: %s ]"
             ,&this->b,&this->w,&this->phi,&this->theta_o,&this->theta_e,&this->cosTheta_o,
             &this->cosTheta_e,&this->twoSided);
  return __return_storage_ptr__;
}

Assistant:

std::string LightBounds::ToString() const {
    return StringPrintf("[ LightBounds b: %s w: %s phi: %f theta_o: %f theta_e: %f "
                        "cosTheta_o: %f cosTheta_e: %f twoSided: %s ]",
                        b, w, phi, theta_o, theta_e, cosTheta_o, cosTheta_e, twoSided);
}